

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteration_benchmark.c
# Opt level: O0

void iterate_using_read(roaring_bitmap_t *bm,uint32_t bufsize)

{
  uint32_t uVar1;
  roaring_uint32_iterator_t *it;
  roaring_uint32_iterator_t *buf;
  uint in_ESI;
  uint32_t i;
  uint32_t ret;
  uint64_t sum;
  roaring_uint32_iterator_t *iter;
  uint32_t *buffer;
  roaring_bitmap_t *in_stack_ffffffffffffffc8;
  uint local_30;
  long lVar2;
  
  it = (roaring_uint32_iterator_t *)malloc((ulong)in_ESI << 2);
  buf = roaring_iterator_create(in_stack_ffffffffffffffc8);
  lVar2 = 0;
  do {
    uVar1 = roaring_uint32_iterator_read(it,(uint32_t *)buf,(uint32_t)((ulong)lVar2 >> 0x20));
    for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
      lVar2 = (ulong)*(uint *)((long)&it->parent + (ulong)local_30 * 4) + lVar2;
    }
  } while (in_ESI <= uVar1);
  roaring_uint32_iterator_free((roaring_uint32_iterator_t *)0x10137d);
  free(it);
  return;
}

Assistant:

void iterate_using_read(roaring_bitmap_t* bm, uint32_t bufsize) {
    uint32_t* buffer = malloc(sizeof(uint32_t) * bufsize);
    roaring_uint32_iterator_t* iter = roaring_iterator_create(bm);
    uint64_t sum = 0;
    while (1) {
        uint32_t ret = roaring_uint32_iterator_read(iter, buffer, bufsize);
        for (uint32_t i = 0; i < ret; i++) {
            sum += buffer[i];
        }
        if (ret < bufsize) {
            break;
        }
    }
    roaring_uint32_iterator_free(iter);
    free(buffer);
    *(volatile uint64_t*)(&sum) = sum;
}